

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O0

void S_SetListener(SoundListener *listener,AActor *listenactor)

{
  uint uVar1;
  zone_t *pzVar2;
  double dVar3;
  AActor *local_18;
  AActor *listenactor_local;
  SoundListener *listener_local;
  
  local_18 = listenactor;
  listenactor_local = (AActor *)listener;
  if (listenactor == (AActor *)0x0) {
    listener->angle = 0.0;
    TVector3<float>::Zero(&listener->position);
    TVector3<float>::Zero
              ((TVector3<float> *)
               ((long)&(listenactor_local->super_DThinker).super_DObject.Class + 4));
    *(undefined1 *)((long)&(listenactor_local->super_DThinker).super_DObject.GCNext + 4) = 0;
    *(undefined8 *)&(listenactor_local->super_DThinker).super_DObject.ObjectFlags = 0;
    *(undefined1 *)((long)&(listenactor_local->super_DThinker).super_DObject.GCNext + 5) = 0;
  }
  else {
    dVar3 = TAngle<double>::Radians(&(listenactor->Angles).Yaw);
    *(float *)&(listenactor_local->super_DThinker).super_DObject.GCNext = (float)dVar3;
    TVector3<float>::Zero
              ((TVector3<float> *)
               ((long)&(listenactor_local->super_DThinker).super_DObject.Class + 4));
    AActor::SoundPos((AActor *)&stack0xffffffffffffffdc);
    TVector3<float>::operator=
              ((TVector3<float> *)listenactor_local,(TVector3<float> *)&stack0xffffffffffffffdc);
    *(bool *)((long)&(listenactor_local->super_DThinker).super_DObject.GCNext + 4) =
         local_18->waterlevel == 3;
    uVar1 = TArray<zone_t,_zone_t>::Size(&Zones);
    if (uVar1 <= local_18->Sector->ZoneNumber) {
      __assert_fail("Zones.Size() > listenactor->Sector->ZoneNumber",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/s_sound.cpp"
                    ,0x81a,"void S_SetListener(SoundListener &, AActor *)");
    }
    pzVar2 = TArray<zone_t,_zone_t>::operator[](&Zones,(ulong)local_18->Sector->ZoneNumber);
    *(ReverbContainer **)&(listenactor_local->super_DThinker).super_DObject.ObjectFlags =
         pzVar2->Environment;
    *(undefined1 *)((long)&(listenactor_local->super_DThinker).super_DObject.GCNext + 5) = 1;
  }
  return;
}

Assistant:

static void S_SetListener(SoundListener &listener, AActor *listenactor)
{
	if (listenactor != NULL)
	{
		listener.angle = (float)listenactor->Angles.Yaw.Radians();
		/*
		listener.velocity.X = listenactor->vel.x * (TICRATE/65536.f);
		listener.velocity.Y = listenactor->vel.z * (TICRATE/65536.f);
		listener.velocity.Z = listenactor->vel.y * (TICRATE/65536.f);
		*/
		listener.velocity.Zero();
		listener.position = listenactor->SoundPos();
		listener.underwater = listenactor->waterlevel == 3;
		assert(Zones.Size() > listenactor->Sector->ZoneNumber);
		listener.Environment = Zones[listenactor->Sector->ZoneNumber].Environment;
		listener.valid = true;
	}
	else
	{
		listener.angle = 0;
		listener.position.Zero();
		listener.velocity.Zero();
		listener.underwater = false;
		listener.Environment = NULL;
		listener.valid = false;
	}
}